

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O2

void __thiscall
choc::value::Type::AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::reserve
          (AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *this,uint32_t needed)

{
  RepeatedGroup *__dest;
  uint uVar1;
  size_t size;
  
  if (this->capacity < needed) {
    uVar1 = needed + 7 & 0xfffffff8;
    size = (ulong)uVar1 * 0x28;
    __dest = (RepeatedGroup *)
             anon_unknown_11::resizeAllocationIfPossible(this->allocator,this->items,size);
    if (__dest == (RepeatedGroup *)0x0) {
      __dest = (RepeatedGroup *)anon_unknown_11::allocateBytes(this->allocator,size);
      if ((ulong)this->size != 0) {
        memcpy(__dest,this->items,(ulong)this->size * 0x28);
      }
      anon_unknown_11::freeBytes(this->allocator,this->items);
    }
    this->items = __dest;
    this->capacity = uVar1;
  }
  return;
}

Assistant:

void reserve (uint32_t needed)
    {
        if (capacity < needed)
        {
            needed = (needed + 7u) & ~7u;
            auto bytesNeeded = sizeof (ObjectType) * needed;

            if (auto reallocated = static_cast<ObjectType*> (resizeAllocationIfPossible (allocator, items, bytesNeeded)))
            {
                items = reallocated;
            }
            else
            {
                auto newItems = allocateBytes (allocator, bytesNeeded);

                if (size != 0)
                    std::memcpy (newItems, items, size * sizeof (ObjectType));

                freeBytes (allocator, items);
                items = static_cast<ObjectType*> (newItems);
            }

            capacity = needed;
        }
    }